

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

int __thiscall r_comp::Decompiler::init(Decompiler *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ulong uVar2;
  Class *pCVar3;
  long lVar4;
  offset_in_Decompiler_to_subr *poVar5;
  code *pcVar6;
  vector<void_(r_comp::Decompiler::*)(unsigned_short)> *this_00;
  ulong uVar7;
  string class_name;
  
  this->metadata = (Metadata *)ctx;
  this->time_offset = 0;
  this->partial_decompilation = false;
  this->ignore_named_objects = false;
  this_00 = &this->renderers;
  uVar7 = 0;
  do {
    uVar7 = uVar7 & 0xffff;
    uVar2 = (*(long *)(ctx + 0xf8) - *(long *)(ctx + 0xf0)) / 0x48;
    if (uVar2 <= uVar7) {
      return (int)uVar2;
    }
    pCVar3 = Metadata::get_class((Metadata *)ctx,uVar7);
    std::__cxx11::string::string((string *)&class_name,(string *)&pCVar3->str_opcode);
    lVar4 = std::__cxx11::string::find((char *)&class_name,0x146729);
    if (lVar4 == -1) {
      bVar1 = std::operator==(&class_name,"grp");
      if (bVar1) {
        poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                           (this_00,uVar7);
        pcVar6 = write_group;
      }
      else {
        bVar1 = std::operator==(&class_name,"ipgm");
        if (!bVar1) {
          bVar1 = std::operator==(&class_name,"icpp_pgm");
          if (!bVar1) {
            bVar1 = std::operator==(&class_name,"pgm");
            if (!bVar1) {
              bVar1 = std::operator==(&class_name,"|pgm");
              if (!bVar1) {
                bVar1 = std::operator==(&class_name,"icmd");
                if (bVar1) {
                  poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                                     (this_00,uVar7);
                  pcVar6 = write_icmd;
                }
                else {
                  bVar1 = std::operator==(&class_name,"cmd");
                  if (bVar1) {
                    poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                             operator[](this_00,uVar7);
                    pcVar6 = write_cmd;
                  }
                  else {
                    bVar1 = std::operator==(&class_name,"fact");
                    if (!bVar1) {
                      bVar1 = std::operator==(&class_name,"|fact");
                      if (!bVar1) {
                        bVar1 = std::operator==(&class_name,"cst");
                        if (!bVar1) {
                          bVar1 = std::operator==(&class_name,"mdl");
                          if (!bVar1) {
                            bVar1 = std::operator==(&class_name,"icst");
                            if (!bVar1) {
                              bVar1 = std::operator==(&class_name,"imdl");
                              if (!bVar1) {
                                poVar5 = r_code::
                                         vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                                         operator[](this_00,uVar7);
                                pcVar6 = write_expression;
                                goto LAB_0013ae2f;
                              }
                            }
                            poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                                     operator[](this_00,uVar7);
                            pcVar6 = write_ihlp;
                            goto LAB_0013ae2f;
                          }
                        }
                        poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                                 operator[](this_00,uVar7);
                        pcVar6 = write_hlp;
                        goto LAB_0013ae2f;
                      }
                    }
                    poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                             operator[](this_00,uVar7);
                    pcVar6 = write_fact;
                  }
                }
                goto LAB_0013ae2f;
              }
            }
            poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                               (this_00,uVar7);
            pcVar6 = write_pgm;
            goto LAB_0013ae2f;
          }
        }
        poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                           (this_00,uVar7);
        pcVar6 = write_ipgm;
      }
    }
    else {
      poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                         (this_00,uVar7);
      pcVar6 = write_marker;
    }
LAB_0013ae2f:
    *poVar5 = (offset_in_Decompiler_to_subr)pcVar6;
    poVar5[1] = 0;
    std::__cxx11::string::~string((string *)&class_name);
    uVar7 = (ulong)((int)uVar7 + 1);
  } while( true );
}

Assistant:

void Decompiler::init(r_comp::Metadata *metadata)
{
    this->metadata = metadata;
    this->time_offset = 0;
    partial_decompilation = false;
    ignore_named_objects = false;

    // Load the renderers;
    for (uint16_t i = 0; i < metadata->classes_by_opcodes.size(); ++i) {
        Class *c = metadata->get_class(i);
        std::string class_name = c->str_opcode;
        size_t p = class_name.find("mk.");

        if (p != std::string::npos) {
            renderers[i] = &Decompiler::write_marker;
        } else if (class_name == "grp") {
            renderers[i] = &Decompiler::write_group;
        } else if (class_name == "ipgm" || class_name == "icpp_pgm") {
            renderers[i] = &Decompiler::write_ipgm;
        } else if (class_name == "pgm" || class_name == "|pgm") {
            renderers[i] = &Decompiler::write_pgm;
        } else if (class_name == "icmd") {
            renderers[i] = &Decompiler::write_icmd;
        } else if (class_name == "cmd") {
            renderers[i] = &Decompiler::write_cmd;
        } else if (class_name == "fact" || class_name == "|fact") {
            renderers[i] = &Decompiler::write_fact;
        } else if (class_name == "cst" || class_name == "mdl") {
            renderers[i] = &Decompiler::write_hlp;
        } else if (class_name == "icst" || class_name == "imdl") {
            renderers[i] = &Decompiler::write_ihlp;
        } else {
            renderers[i] = &Decompiler::write_expression;
        }
    }
}